

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,EndpointDeclaration *e)

{
  bool bVar1;
  string *name;
  EndpointDetails *pEVar2;
  Identifier *args;
  pool_ptr<soul::AST::Expression> local_58;
  CompileMessage local_50;
  
  ASTVisitor::visit(&this->super_ASTVisitor,e);
  name = Identifier::operator_cast_to_string_(&e->name);
  bVar1 = heart::isReservedFunctionName(name);
  if (!bVar1) {
    bVar1 = AST::EndpointDeclaration::isResolved(e);
    if (bVar1) {
      checkEndpointDataTypes(e);
      pEVar2 = pool_ptr<soul::AST::EndpointDetails>::operator*(&e->details);
      local_58.object = (pEVar2->arraySize).object;
      checkArraySize(this,&local_58,0x100);
    }
    return;
  }
  Errors::invalidEndpointName<soul::Identifier&>(&local_50,(Errors *)&e->name,args);
  AST::Context::throwError(&(e->super_ASTObject).context,&local_50,false);
}

Assistant:

void visit (AST::EndpointDeclaration& e) override
        {
            super::visit (e);

            if (heart::isReservedFunctionName (e.name))
                e.context.throwError (Errors::invalidEndpointName (e.name));

            if (e.isResolved())
            {
                checkEndpointDataTypes (e);
                checkArraySize (e.getDetails().arraySize, AST::maxEndpointArraySize);
            }
        }